

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Maybe<capnp::JsonCodec::HandlerBase_*const_&> __thiscall
kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::Type&>
          (HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *this,Type *key)

{
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> MVar1;
  long lVar2;
  ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
  find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::Type&>
            (local_20,table,
             (Type *)(((long)(*(long *)(this + 8) - *(size_t *)this) >> 3) * -0x5555555555555555));
  lVar2 = 0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0) {
    lVar2 = local_18 * 0x18 + *(long *)this;
  }
  MVar1.ptr = (HandlerBase **)(lVar2 + 0x10);
  if (lVar2 == 0) {
    MVar1.ptr = (HandlerBase **)0x0;
  }
  return (Maybe<capnp::JsonCodec::HandlerBase_*const_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}